

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcGen.c
# Opt level: O1

void Abc_GenOneHotIntervals(char *pFileName,int nPis,int nRegs,Vec_Ptr_t *vOnehots)

{
  long lVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  uint uVar5;
  FILE *__stream;
  char *pcVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  __stream = fopen(pFileName,"w");
  uVar12 = 0;
  pcVar6 = Extra_TimeStamp();
  fprintf(__stream,"# One-hotness with %d vars and %d regs generated by ABC on %s\n",nPis,
          (ulong)(uint)nRegs,pcVar6);
  fprintf(__stream,"# Used %d intervals of 1-hot registers: { ",(ulong)(uint)vOnehots->nSize);
  if (0 < vOnehots->nSize) {
    lVar7 = 0;
    uVar12 = 0;
    do {
      pvVar3 = vOnehots->pArray[lVar7];
      fprintf(__stream,"%d ",(ulong)*(uint *)((long)pvVar3 + 4));
      iVar2 = *(int *)((long)pvVar3 + 4);
      uVar12 = uVar12 + ((iVar2 + -1) * iVar2) / 2;
      lVar7 = lVar7 + 1;
    } while (lVar7 < vOnehots->nSize);
  }
  fwrite("}\n",2,1,__stream);
  fprintf(__stream,".model 1hot_%dvars_%dregs\n",(ulong)(uint)nPis,(ulong)(uint)nRegs);
  fwrite(".inputs",7,1,__stream);
  uVar13 = nRegs + nPis;
  uVar14 = uVar13;
  if (1 < uVar13) {
    uVar14 = 0;
    uVar5 = uVar13 - 1;
    if (uVar5 != 0) {
      do {
        uVar14 = uVar14 + 1;
        bVar4 = 9 < uVar5;
        uVar5 = uVar5 / 10;
      } while (bVar4);
    }
  }
  if (0 < (int)uVar13) {
    uVar10 = 0;
    do {
      fprintf(__stream," i%0*d",(ulong)uVar14,uVar10);
      uVar5 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar5;
    } while (uVar13 != uVar5);
  }
  fputc(10,__stream);
  fwrite(".outputs",8,1,__stream);
  uVar10 = (ulong)uVar12;
  if (1 < uVar12) {
    uVar10 = 0;
    uVar13 = uVar12 - 1;
    if (uVar13 != 0) {
      do {
        uVar10 = (ulong)((int)uVar10 + 1);
        bVar4 = 9 < uVar13;
        uVar13 = uVar13 / 10;
      } while (bVar4);
    }
  }
  if (0 < (int)uVar12) {
    uVar11 = 0;
    do {
      fprintf(__stream," o%0*d",uVar10,uVar11);
      uVar13 = (int)uVar11 + 1;
      uVar11 = (ulong)uVar13;
    } while (uVar12 != uVar13);
  }
  fputc(10,__stream);
  if (vOnehots->nSize < 1) {
    uVar11 = 0;
  }
  else {
    lVar7 = 0;
    uVar11 = 0;
    do {
      pvVar3 = vOnehots->pArray[lVar7];
      if (0 < *(int *)((long)pvVar3 + 4)) {
        lVar8 = 1;
        lVar9 = 0;
        do {
          lVar1 = lVar9 + 1;
          if (lVar1 < *(int *)((long)pvVar3 + 4)) {
            iVar2 = *(int *)(*(long *)((long)pvVar3 + 8) + lVar9 * 4);
            lVar9 = lVar8;
            do {
              fprintf(__stream,".names i%0*d i%0*d o%0*d\n",(ulong)uVar14,
                      (ulong)(uint)(iVar2 + nPis),(ulong)uVar14,
                      (ulong)(uint)(*(int *)(*(long *)((long)pvVar3 + 8) + lVar9 * 4) + nPis),uVar10
                      ,uVar11);
              fwrite("11 0\n",5,1,__stream);
              uVar11 = (ulong)((int)uVar11 + 1);
              lVar9 = lVar9 + 1;
            } while ((int)lVar9 < *(int *)((long)pvVar3 + 4));
          }
          lVar8 = lVar8 + 1;
          lVar9 = lVar1;
        } while (lVar1 < *(int *)((long)pvVar3 + 4));
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < vOnehots->nSize);
  }
  if (uVar12 != (uint)uVar11) {
    __assert_fail("Counter == Counter2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcGen.c"
                  ,0x2a7,"void Abc_GenOneHotIntervals(char *, int, int, Vec_Ptr_t *)");
  }
  fwrite(".end\n",5,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Abc_GenOneHotIntervals( char * pFileName, int nPis, int nRegs, Vec_Ptr_t * vOnehots )
{
    Vec_Int_t * vLine;
    FILE * pFile;
    int i, j, k, iReg1, iReg2, Counter, Counter2, nDigitsIn, nDigitsOut;
    pFile = fopen( pFileName, "w" );
    fprintf( pFile, "# One-hotness with %d vars and %d regs generated by ABC on %s\n", nPis, nRegs, Extra_TimeStamp() );
    fprintf( pFile, "# Used %d intervals of 1-hot registers: { ", Vec_PtrSize(vOnehots) );
    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        fprintf( pFile, "%d ", Vec_IntSize(vLine) );
        Counter += Vec_IntSize(vLine) * (Vec_IntSize(vLine) - 1) / 2;
    }
    fprintf( pFile, "}\n" );
    fprintf( pFile, ".model 1hot_%dvars_%dregs\n", nPis, nRegs );
    fprintf( pFile, ".inputs" );
    nDigitsIn = Abc_Base10Log( nPis+nRegs );
    for ( i = 0; i < nPis+nRegs; i++ )
        fprintf( pFile, " i%0*d", nDigitsIn, i );
    fprintf( pFile, "\n" );
    fprintf( pFile, ".outputs" );
    nDigitsOut = Abc_Base10Log( Counter );
    for ( i = 0; i < Counter; i++ )
        fprintf( pFile, " o%0*d", nDigitsOut, i );
    fprintf( pFile, "\n" );
    Counter2 = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vOnehots, vLine, k )
    {
        Vec_IntForEachEntry( vLine, iReg1, i )
        Vec_IntForEachEntryStart( vLine, iReg2, j, i+1 )
        {
            fprintf( pFile, ".names i%0*d i%0*d o%0*d\n", nDigitsIn, nPis+iReg1, nDigitsIn, nPis+iReg2, nDigitsOut, Counter2 ); 
            fprintf( pFile, "11 0\n" ); 
            Counter2++;
        }
    }
    assert( Counter == Counter2 );
    fprintf( pFile, ".end\n" ); 
    fprintf( pFile, "\n" ); 
    fclose( pFile );
}